

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void TCLAP::ClearContainer<std::__cxx11::list<TCLAP::Visitor*,std::allocator<TCLAP::Visitor*>>>
               (list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *c)

{
  iterator __first;
  iterator __last;
  list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *c_local;
  
  __first = std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::begin(c);
  __last = std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::end(c);
  __std__for_each<std::_List_iterator<TCLAP::Visitor*>,void(*)(TCLAP::Visitor*)>_std___List_iterator<TCLAP::Visitor*>_std___List_iterator<TCLAP::Visitor*>_void____TCLAP__Visitor____
            ((_List_iterator<TCLAP::Visitor_*>)__first._M_node,
             (_List_iterator<TCLAP::Visitor_*>)__last._M_node,DelPtr<TCLAP::Visitor*>);
  std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::clear(c);
  return;
}

Assistant:

void ClearContainer(C &c)
{
	typedef typename C::value_type value_type;
	std::for_each(c.begin(), c.end(), DelPtr<value_type>);
	c.clear();
}